

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O2

FBaseCVar * FindCVarSub(char *var_name,int namelen)

{
  FBaseCVar *pFVar1;
  char *__s1;
  int iVar2;
  FBaseCVar **ppFVar3;
  
  if (var_name != (char *)0x0) {
    ppFVar3 = &CVars;
    while (pFVar1 = *ppFVar3, pFVar1 != (FBaseCVar *)0x0) {
      __s1 = pFVar1->Name;
      iVar2 = strncasecmp(__s1,var_name,(long)namelen);
      if ((iVar2 == 0) && (__s1[namelen] == '\0')) {
        return pFVar1;
      }
      ppFVar3 = &pFVar1->m_Next;
    }
  }
  return (FBaseCVar *)0x0;
}

Assistant:

FBaseCVar *FindCVarSub (const char *var_name, int namelen)
{
	FBaseCVar *var;

	if (var_name == NULL)
		return NULL;

	var = CVars;
	while (var)
	{
		const char *probename = var->GetName ();

		if (strnicmp (probename, var_name, namelen) == 0 &&
			probename[namelen] == 0)
		{
			break;
		}
		var = var->m_Next;
	}
	return var;
}